

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrunsym.cpp
# Opt level: O0

char * __thiscall
CVmRuntimeSymbols::find_val_name(CVmRuntimeSymbols *this,vm_val_t *val,size_t *name_len)

{
  int iVar1;
  undefined8 *in_RDX;
  undefined8 in_RSI;
  vm_val_t *in_RDI;
  vm_runtime_sym *sym;
  undefined8 *local_28;
  vm_val_t *in_stack_fffffffffffffff8;
  
  local_28 = *(undefined8 **)in_RDI;
  while( true ) {
    if (local_28 == (undefined8 *)0x0) {
      *in_RDX = 0;
      return (char *)0x0;
    }
    iVar1 = vm_val_t::equals(in_stack_fffffffffffffff8,in_RDI,(int)((ulong)in_RSI >> 0x20));
    if (iVar1 != 0) break;
    local_28 = (undefined8 *)*local_28;
  }
  *in_RDX = local_28[2];
  return (char *)local_28[1];
}

Assistant:

const char *CVmRuntimeSymbols::find_val_name(VMG_ const vm_val_t *val,
                                             size_t *name_len) const
{
    vm_runtime_sym *sym;

    /* search the table */
    for (sym = head_ ; sym != 0 ; sym = sym->nxt)
    {
        /* check for a match to the value */
        if (val->equals(vmg_ &sym->val))
        {
            /* it's a match - return the name */
            *name_len = sym->len;
            return sym->sym;
        }
    }

    /* didn't find it - return null */
    *name_len = 0;
    return 0;
}